

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

int grow_expansion(int elen,double *e,double b,double *h)

{
  ulong uVar1;
  ulong uVar2;
  double Q;
  double dVar3;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)elen;
  if (elen < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    dVar3 = b + e[uVar1];
    h[uVar1] = (b - (dVar3 - (dVar3 - b))) + (e[uVar1] - (dVar3 - b));
    b = dVar3;
  }
  h[uVar2] = b;
  return (int)uVar2 + 1;
}

Assistant:

int grow_expansion(int elen, REAL *e, REAL b, REAL *h)
/* e and h can be the same. */
{
  REAL Q;
  INEXACT REAL Qnew;
  int eindex;
  REAL enow;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;

  Q = b;
  for (eindex = 0; eindex < elen; eindex++) {
    enow = e[eindex];
    Two_Sum(Q, enow, Qnew, h[eindex]);
    Q = Qnew;
  }
  h[eindex] = Q;
  return eindex + 1;
}